

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O3

void __thiscall
t_java_generator::generate_process_function
          (t_java_generator *this,t_service *tservice,t_function *tfunction)

{
  ofstream_with_content_based_conditional_update *os;
  int *piVar1;
  pointer pcVar2;
  t_struct *ptVar3;
  t_function *ptVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  ostream *poVar8;
  pointer pptVar9;
  char *pcVar10;
  char *pcVar11;
  string argsname;
  string resultname;
  string local_120;
  char *local_100;
  long local_f8;
  char local_f0 [16];
  t_struct *local_e0;
  char *local_d8;
  char *local_d0;
  char local_c8 [16];
  t_function *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_100 = local_f0;
  pcVar2 = (tfunction->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,pcVar2,pcVar2 + (tfunction->name_)._M_string_length);
  std::__cxx11::string::append((char *)&local_100);
  local_d8 = local_c8;
  pcVar2 = (tfunction->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar2,pcVar2 + (tfunction->name_)._M_string_length);
  std::__cxx11::string::append((char *)&local_d8);
  if (tfunction->oneway_ == true) {
    std::__cxx11::string::_M_replace((ulong)&local_d8,0,local_d0,0x395d15);
  }
  os = &this->f_service_;
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"public static class ",0x14);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(tfunction->name_)._M_dataplus._M_p,(tfunction->name_)._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"<I extends Iface> extends org.apache.thrift.ProcessFunction<I, ",0x3f);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_100,local_f8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"> {",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"public ",7);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(tfunction->name_)._M_dataplus._M_p,(tfunction->name_)._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"() {",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  super(\"",9);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(tfunction->name_)._M_dataplus._M_p,(tfunction->name_)._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\");",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"public ",7);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_100,local_f8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," getEmptyArgsInstance() {",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  return new ",0xd);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_100,local_f8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"();",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"protected boolean isOneway() {",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  return ",9);
  pcVar11 = "false";
  pcVar10 = "false";
  if ((ulong)tfunction->oneway_ != 0) {
    pcVar10 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar10,(ulong)tfunction->oneway_ ^ 5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,";",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"@Override",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"protected boolean rethrowUnhandledExceptions() {",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  return ",9);
  if ((ulong)this->rethrow_unhandled_exceptions_ != 0) {
    pcVar11 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,pcVar11,(ulong)this->rethrow_unhandled_exceptions_ ^ 5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,";",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"public ",7);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_d8,(long)local_d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," getResult(I iface, ",0x14);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_100,local_f8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8," args) throws org.apache.thrift.TException {",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  if (tfunction->oneway_ == false) {
    poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_d8,(long)local_d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," result = new ",0xe);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_d8,(long)local_d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"();",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  local_e0 = tfunction->xceptions_;
  if ((local_e0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (local_e0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    t_generator::indent_abi_cxx11_(&local_120,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,local_120._M_dataplus._M_p,local_120._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"try {",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
  }
  ptVar3 = tfunction->arglist_;
  t_generator::indent_abi_cxx11_(&local_120,(t_generator *)this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)os,local_120._M_dataplus._M_p,local_120._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (tfunction->oneway_ == false) {
    iVar7 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar7 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"result.success = ",0x11);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"iface.",6);
  pcVar2 = (tfunction->name_)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (tfunction->name_)._M_string_length);
  get_rpc_method_name(&local_120,this,&local_50);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)os,local_120._M_dataplus._M_p,local_120._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  local_b8 = tfunction;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pptVar9 = (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar9 !=
      (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar5 = true;
    do {
      if (!bVar5) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,", ",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"args.",5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os,((*pptVar9)->name_)._M_dataplus._M_p,
                 ((*pptVar9)->name_)._M_string_length);
      pptVar9 = pptVar9 + 1;
      bVar5 = false;
    } while (pptVar9 !=
             (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,");",2);
  ptVar4 = local_b8;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (ptVar4->oneway_ == false) {
    iVar7 = (*(ptVar4->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar7 == '\0') {
      bVar5 = type_can_be_null(this,ptVar4->returntype_);
      if (!bVar5) {
        poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"result.set",10);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"success","");
        get_cap_name(&local_120,this,&local_70);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_120._M_dataplus._M_p,local_120._M_string_length);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"isSet","");
        get_cap_name(&local_90,this,&local_b0);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_90._M_dataplus._M_p,local_90._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(true);",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
      }
    }
  }
  bVar6 = ptVar4->oneway_;
  if (((bool)bVar6 == false) &&
     ((local_e0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (local_e0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_120,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,local_120._M_dataplus._M_p,local_120._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    pptVar9 = (local_e0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    if (pptVar9 !=
        (local_e0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)os," catch (",8);
        type_name_abi_cxx11_(&local_120,this,(*pptVar9)->type_,false,false,false,false);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)os,local_120._M_dataplus._M_p,local_120._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,((*pptVar9)->name_)._M_dataplus._M_p,
                            ((*pptVar9)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") {",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p);
        }
        if (ptVar4->oneway_ == false) {
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 1;
          t_generator::indent_abi_cxx11_(&local_120,(t_generator *)this);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)os,local_120._M_dataplus._M_p,local_120._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"result.",7);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,((*pptVar9)->name_)._M_dataplus._M_p,
                              ((*pptVar9)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,((*pptVar9)->name_)._M_dataplus._M_p,
                              ((*pptVar9)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,";",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p);
          }
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + -1;
          t_generator::indent_abi_cxx11_(&local_120,(t_generator *)this);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)os,local_120._M_dataplus._M_p,local_120._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"}",1);
        }
        pptVar9 = pptVar9 + 1;
      } while (pptVar9 !=
               (local_e0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    bVar6 = ptVar4->oneway_;
  }
  if ((bVar6 & 1) == 0) {
    poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return result;",0xe);
  }
  else {
    poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return null;",0xc);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_120,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)os,local_120._M_dataplus._M_p,local_120._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  if (local_100 != local_f0) {
    operator_delete(local_100);
  }
  return;
}

Assistant:

void t_java_generator::generate_process_function(t_service* tservice, t_function* tfunction) {
  string argsname = tfunction->get_name() + "_args";
  string resultname = tfunction->get_name() + "_result";
  if (tfunction->is_oneway()) {
    resultname = "org.apache.thrift.TBase";
  }

  (void)tservice;
  // Open class
  indent(f_service_) << "public static class " << tfunction->get_name()
                     << "<I extends Iface> extends org.apache.thrift.ProcessFunction<I, "
                     << argsname << "> {" << endl;
  indent_up();

  indent(f_service_) << "public " << tfunction->get_name() << "() {" << endl;
  indent(f_service_) << "  super(\"" << tfunction->get_name() << "\");" << endl;
  indent(f_service_) << "}" << endl << endl;

  indent(f_service_) << "public " << argsname << " getEmptyArgsInstance() {" << endl;
  indent(f_service_) << "  return new " << argsname << "();" << endl;
  indent(f_service_) << "}" << endl << endl;

  indent(f_service_) << "protected boolean isOneway() {" << endl;
  indent(f_service_) << "  return " << ((tfunction->is_oneway()) ? "true" : "false") << ";" << endl;
  indent(f_service_) << "}" << endl << endl;

  indent(f_service_) << "@Override" << endl;
  indent(f_service_) << "protected boolean rethrowUnhandledExceptions() {" << endl;
  indent(f_service_) << "  return " << ((rethrow_unhandled_exceptions_) ? "true" : "false") << ";" << endl;
  indent(f_service_) << "}" << endl << endl;

  indent(f_service_) << "public " << resultname << " getResult(I iface, " << argsname
                     << " args) throws org.apache.thrift.TException {" << endl;
  indent_up();
  if (!tfunction->is_oneway()) {
    indent(f_service_) << resultname << " result = new " << resultname << "();" << endl;
  }

  t_struct* xs = tfunction->get_xceptions();
  const std::vector<t_field*>& xceptions = xs->get_members();
  vector<t_field*>::const_iterator x_iter;

  // Try block for a function with exceptions
  if (xceptions.size() > 0) {
    f_service_ << indent() << "try {" << endl;
    indent_up();
  }

  // Generate the function call
  t_struct* arg_struct = tfunction->get_arglist();
  const std::vector<t_field*>& fields = arg_struct->get_members();
  vector<t_field*>::const_iterator f_iter;
  f_service_ << indent();

  if (!tfunction->is_oneway() && !tfunction->get_returntype()->is_void()) {
    f_service_ << "result.success = ";
  }
  f_service_ << "iface." << get_rpc_method_name(tfunction->get_name()) << "(";
  bool first = true;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
    } else {
      f_service_ << ", ";
    }
    f_service_ << "args." << (*f_iter)->get_name();
  }
  f_service_ << ");" << endl;

  // Set isset on success field
  if (!tfunction->is_oneway() && !tfunction->get_returntype()->is_void()
      && !type_can_be_null(tfunction->get_returntype())) {
    indent(f_service_) << "result.set" << get_cap_name("success") << get_cap_name("isSet")
                       << "(true);" << endl;
  }

  if (!tfunction->is_oneway() && xceptions.size() > 0) {
    indent_down();
    f_service_ << indent() << "}";
    for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
      f_service_ << " catch (" << type_name((*x_iter)->get_type(), false, false) << " "
                 << (*x_iter)->get_name() << ") {" << endl;
      if (!tfunction->is_oneway()) {
        indent_up();
        f_service_ << indent() << "result." << (*x_iter)->get_name() << " = "
                   << (*x_iter)->get_name() << ";" << endl;
        indent_down();
        f_service_ << indent() << "}";
      } else {
        f_service_ << "}";
      }
    }
    f_service_ << endl;
  }

  if (tfunction->is_oneway()) {
    indent(f_service_) << "return null;" << endl;
  } else {
    indent(f_service_) << "return result;" << endl;
  }
  indent_down();
  indent(f_service_) << "}";

  // Close function
  f_service_ << endl;

  // Close class
  indent_down();
  f_service_ << indent() << "}" << endl << endl;
}